

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

double __thiscall
imrt::EvaluationFunction::eval
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  std::
  _Rb_tree<std::pair<double,_std::pair<int,_int>_>,_std::pair<double,_std::pair<int,_int>_>,_std::_Identity<std::pair<double,_std::pair<int,_int>_>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::clear(&(this->voxels)._M_t);
  generate_Z(this,p);
  this->F = 0.0;
  iVar2 = this->nb_organs;
  if (iVar2 < 1) {
    dVar6 = 0.0;
  }
  else {
    piVar1 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      iVar3 = piVar1[lVar5];
      dVar8 = 0.0;
      if (0 < iVar3) {
        lVar4 = 0;
        do {
          dVar6 = *(double *)
                   (*(long *)&(this->Z).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar5].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + lVar4 * 8);
          dVar7 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          if (dVar6 < dVar7) {
            dVar7 = dVar7 - dVar6;
            dVar8 = dVar8 + dVar7 * dVar7 *
                            (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar5];
          }
          dVar7 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          if (dVar7 < dVar6) {
            dVar6 = dVar6 - dVar7;
            dVar8 = dVar8 + dVar6 * dVar6 *
                            (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar5];
          }
          update_sorted_voxels(this,w,Zmin,Zmax,(int)lVar5,(int)lVar4);
          update_beamlets_impact(this,(int)lVar5,(int)lVar4,0.0);
          lVar4 = lVar4 + 1;
          piVar1 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = piVar1[lVar5];
        } while (lVar4 < iVar3);
        dVar6 = this->F;
        iVar2 = this->nb_organs;
      }
      dVar6 = dVar6 + dVar8 / (double)iVar3;
      this->F = dVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  n_evaluations = n_evaluations + 1;
  return dVar6;
}

Assistant:

double EvaluationFunction::eval(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	voxels.clear();
	generate_Z(p);
	F=0.0;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(Z[o][k] < Zmin[o] )
				 pen += w[o] * ( pow(Zmin[o]-Z[o][k], 2) );

			if(Z[o][k] > Zmax[o] )
				 pen += w[o] * ( pow(Z[o][k]-Zmax[o], 2) );

			update_sorted_voxels(w, Zmin, Zmax, o, k);
			update_beamlets_impact(o, k);
		}
		F+=pen/nb_voxels[o];
	}

	//for(auto b:beamlet_impact)
		//cout << b.first.first << "," << b.first.second << ":" << b.second << " " << endl;

	n_evaluations++;
	return F;
}